

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_error.c
# Opt level: O0

void skynet_error(skynet_context *context,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined1 local_158 [8];
  skynet_message smsg;
  int max_size;
  int len;
  va_list ap;
  char *data;
  char tmp [256];
  char *msg_local;
  skynet_context *context_local;
  
  if (in_AL != '\0') {
    local_1d8 = in_XMM0_Qa;
    local_1c8 = in_XMM1_Qa;
    local_1b8 = in_XMM2_Qa;
    local_1a8 = in_XMM3_Qa;
    local_198 = in_XMM4_Qa;
    local_188 = in_XMM5_Qa;
    local_178 = in_XMM6_Qa;
    local_168 = in_XMM7_Qa;
  }
  local_1f8 = in_RDX;
  local_1f0 = in_RCX;
  local_1e8 = in_R8;
  local_1e0 = in_R9;
  tmp._248_8_ = msg;
  if (skynet_error::logger == 0) {
    skynet_error::logger = skynet_handle_findname("logger");
  }
  if (skynet_error::logger != 0) {
    ap[0].reg_save_area = (void *)0x0;
    ap[0].overflow_arg_area = local_208;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    max_size = 0x10;
    smsg.sz._4_4_ = vsnprintf((char *)&data,0x100,(char *)tmp._248_8_,&max_size);
    if (smsg.sz._4_4_ < 0x100) {
      ap[0].reg_save_area = skynet_strdup((char *)&data);
    }
    else {
      smsg.sz._0_4_ = 0x100;
      while( true ) {
        smsg.sz._0_4_ = (int)smsg.sz << 1;
        ap[0].reg_save_area = malloc((long)(int)smsg.sz);
        ap[0].overflow_arg_area = local_208;
        ap[0]._0_8_ = &stack0x00000008;
        len = 0x30;
        max_size = 0x10;
        smsg.sz._4_4_ =
             vsnprintf((char *)ap[0].reg_save_area,(long)(int)smsg.sz,(char *)tmp._248_8_,&max_size)
        ;
        if (smsg.sz._4_4_ < (int)smsg.sz) break;
        free(ap[0].reg_save_area);
      }
    }
    if (context == (skynet_context *)0x0) {
      local_158._0_4_ = 0;
    }
    else {
      local_158._0_4_ = skynet_context_handle(context);
    }
    local_158._4_4_ = 0;
    smsg._0_8_ = ap[0].reg_save_area;
    smsg.data = (void *)(long)smsg.sz._4_4_;
    skynet_context_push(skynet_error::logger,(skynet_message *)local_158);
  }
  return;
}

Assistant:

void 
skynet_error(struct skynet_context * context, const char *msg, ...) {
	static uint32_t logger = 0;
	if (logger == 0) {
		logger = skynet_handle_findname("logger");
	}
	if (logger == 0) {
		return;
	}

	char tmp[LOG_MESSAGE_SIZE];
	char *data = NULL;

	va_list ap;

	va_start(ap,msg);
	int len = vsnprintf(tmp, LOG_MESSAGE_SIZE, msg, ap);
	va_end(ap);
	if (len < LOG_MESSAGE_SIZE) {
		data = skynet_strdup(tmp);
	} else {
		int max_size = LOG_MESSAGE_SIZE;
		for (;;) {
			max_size *= 2;
			data = skynet_malloc(max_size);
			va_start(ap,msg);
			len = vsnprintf(data, max_size, msg, ap);
			va_end(ap);
			if (len < max_size) {
				break;
			}
			skynet_free(data);
		}
	}


	struct skynet_message smsg;
	if (context == NULL) {
		smsg.source = 0;
	} else {
		smsg.source = skynet_context_handle(context);
	}
	smsg.session = 0;
	smsg.data = data;
	smsg.sz = len | ((size_t)PTYPE_TEXT << MESSAGE_TYPE_SHIFT);
	skynet_context_push(logger, &smsg);
}